

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall
IteratorTest_IsOutputIterator_Test::~IteratorTest_IsOutputIterator_Test
          (IteratorTest_IsOutputIterator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(IteratorTest, IsOutputIterator) {
  EXPECT_TRUE(fmt::internal::is_output_iterator<char*>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<const char*>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<std::string>::value);
  EXPECT_TRUE(fmt::internal::is_output_iterator<
              std::back_insert_iterator<std::string>>::value);
  EXPECT_TRUE(fmt::internal::is_output_iterator<
              std::string::iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<
               std::string::const_iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<std::list<char>>::value);
  EXPECT_TRUE(fmt::internal::is_output_iterator<
              std::list<char>::iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<
               std::list<char>::const_iterator>::value);
  EXPECT_FALSE(fmt::internal::is_output_iterator<uint32_pair>::value);
}